

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_phys.c
# Opt level: O1

REF_STATUS ref_phys_wall_distance(REF_GRID ref_grid,REF_DICT ref_dict,REF_DBL *distance)

{
  REF_INT item;
  REF_MPI ref_mpi;
  REF_NODE ref_node;
  REF_GLOB *pRVar1;
  bool bVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  REF_INT *send_size;
  long lVar7;
  REF_INT *recv_size;
  long lVar8;
  void *pvVar9;
  REF_DBL *pRVar10;
  int *__ptr;
  REF_INT *part_ncell;
  REF_INT *permutation;
  int iVar11;
  ulong uVar12;
  ulong uVar13;
  undefined8 uVar14;
  int iVar15;
  int iVar16;
  int iVar17;
  int iVar18;
  long lVar19;
  char *pcVar20;
  int iVar21;
  uint uVar22;
  REF_DBL *xyz;
  REF_INT part_complete;
  REF_INT ncell;
  REF_SEARCH ref_search;
  REF_INT local_node_per;
  REF_INT local_ncell;
  REF_DBL *local_xyz;
  REF_DBL radius;
  REF_DBL center [3];
  undefined8 in_stack_fffffffffffffec8;
  undefined4 uVar23;
  REF_DBL **in_stack_fffffffffffffed0;
  REF_STATUS local_124;
  REF_DBL *local_108;
  ulong local_f8;
  void *local_f0;
  REF_DBL *local_d8;
  REF_INT local_d0;
  uint local_cc;
  REF_DBL *local_c8;
  REF_DBL *local_c0;
  REF_GRID local_b8;
  REF_SEARCH local_b0;
  ulong local_a8;
  REF_DBL *local_a0;
  void *local_98;
  void *local_90;
  int local_84;
  uint local_80;
  REF_INT local_7c;
  REF_DBL *local_78;
  ulong local_70;
  REF_DBL *local_68;
  ulong local_60;
  ulong local_58;
  double local_50;
  REF_DBL local_48 [3];
  
  uVar23 = (undefined4)((ulong)in_stack_fffffffffffffec8 >> 0x20);
  ref_mpi = ref_grid->mpi;
  ref_node = ref_grid->node;
  uVar3 = (ref_grid->twod == 0) + 2;
  local_b8 = ref_grid;
  if ((long)ref_mpi->n < 0) {
    local_124 = 1;
    pcVar20 = "malloc a_size of REF_INT negative";
LAB_001aea12:
    bVar2 = false;
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_phys.c",0x6dc,
           "ref_phys_wall_distance",pcVar20);
    send_size = (REF_INT *)0x0;
  }
  else {
    send_size = (REF_INT *)malloc((long)ref_mpi->n << 2);
    if (send_size == (REF_INT *)0x0) {
      local_124 = 2;
      pcVar20 = "malloc a_size of REF_INT NULL";
      goto LAB_001aea12;
    }
    bVar2 = true;
    if (0 < ref_mpi->n) {
      lVar7 = 0;
      do {
        send_size[lVar7] = 0;
        lVar7 = lVar7 + 1;
      } while (lVar7 < ref_mpi->n);
    }
  }
  if (!bVar2) {
    return local_124;
  }
  if ((long)ref_mpi->n < 0) {
    local_124 = 1;
    pcVar20 = "malloc b_size of REF_INT negative";
LAB_001aea99:
    bVar2 = false;
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_phys.c",0x6dd,
           "ref_phys_wall_distance",pcVar20);
    recv_size = (REF_INT *)0x0;
  }
  else {
    recv_size = (REF_INT *)malloc((long)ref_mpi->n << 2);
    if (recv_size == (REF_INT *)0x0) {
      local_124 = 2;
      pcVar20 = "malloc b_size of REF_INT NULL";
      goto LAB_001aea99;
    }
    bVar2 = true;
    if (0 < ref_mpi->n) {
      lVar7 = 0;
      do {
        recv_size[lVar7] = 0;
        lVar7 = lVar7 + 1;
      } while (lVar7 < ref_mpi->n);
    }
  }
  if (!bVar2) {
    return local_124;
  }
  uVar22 = 0;
  iVar11 = 0;
  if (0 < (long)ref_node->max) {
    lVar7 = 0;
    iVar11 = 0;
    do {
      if (-1 < ref_node->global[lVar7]) {
        iVar11 = iVar11 + (uint)(ref_node->ref_mpi->id == ref_node->part[lVar7]);
      }
      lVar7 = lVar7 + 1;
    } while (ref_node->max != lVar7);
  }
  iVar4 = (int)(0x7fffffff / (long)ref_mpi->n);
  if (iVar11 < iVar4) {
    iVar4 = iVar11;
  }
  if (0 < ref_node->max) {
    pRVar1 = ref_node->global;
    lVar7 = 0;
    uVar22 = 0;
    iVar11 = 0;
    do {
      if (((-1 < pRVar1[lVar7]) && (ref_node->ref_mpi->id == ref_node->part[lVar7])) &&
         (iVar11 < iVar4)) {
        iVar15 = ref_mpi->n;
        iVar17 = (iVar4 + -1 + iVar15) / iVar15;
        iVar16 = iVar11 / iVar17;
        iVar5 = (iVar4 + -1) / iVar15;
        iVar15 = iVar4 - iVar15 * iVar5;
        if (iVar15 <= iVar16) {
          iVar16 = (iVar11 - iVar17 * iVar15) / iVar5 + iVar15;
        }
        if (ref_mpi->id == iVar16) {
          uVar22 = uVar22 + 1;
        }
        else {
          send_size[iVar16] = send_size[iVar16] + 1;
        }
        iVar11 = iVar11 + 1;
      }
      lVar7 = lVar7 + 1;
    } while (lVar7 < ref_node->max);
  }
  if ((int)uVar22 < 0) {
    bVar2 = false;
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_phys.c",0x6f8,
           "ref_phys_wall_distance","malloc stationary of REF_INT negative");
    local_124 = 1;
  }
  else {
    local_f0 = malloc((ulong)uVar22 * 4);
    if (local_f0 == (void *)0x0) {
      bVar2 = false;
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_phys.c",0x6f8,
             "ref_phys_wall_distance","malloc stationary of REF_INT NULL");
      local_124 = 2;
      local_f0 = (void *)0x0;
    }
    else {
      bVar2 = true;
      if (uVar22 != 0) {
        memset(local_f0,0xff,(ulong)uVar22 << 2);
      }
    }
  }
  if (!bVar2) {
    return local_124;
  }
  uVar22 = ref_mpi_alltoall(ref_mpi,send_size,recv_size,1);
  if (uVar22 != 0) {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_phys.c",0x6fb,
           "ref_phys_wall_distance",(ulong)uVar22,"alltoall sizes");
    return uVar22;
  }
  iVar11 = ref_mpi->n;
  lVar7 = (long)iVar11;
  if (lVar7 < 1) {
    uVar22 = 0;
  }
  else {
    lVar8 = 0;
    uVar22 = 0;
    do {
      uVar22 = uVar22 + send_size[lVar8];
      lVar8 = lVar8 + 1;
    } while (lVar7 != lVar8);
  }
  if ((int)uVar22 < 0) {
    pcVar20 = "malloc a_xyz of REF_DBL negative";
    uVar14 = 0x6ff;
    goto LAB_001aed6f;
  }
  pvVar9 = malloc((ulong)(uVar22 * 3) << 3);
  if (pvVar9 == (void *)0x0) {
    pcVar20 = "malloc a_xyz of REF_DBL NULL";
    uVar14 = 0x6ff;
  }
  else {
    local_90 = pvVar9;
    pvVar9 = malloc((ulong)uVar22 << 3);
    if (pvVar9 == (void *)0x0) {
      pcVar20 = "malloc a_dist of REF_DBL NULL";
      uVar14 = 0x700;
    }
    else {
      if (iVar11 < 1) {
        uVar12 = 0;
      }
      else {
        lVar8 = 0;
        uVar12 = 0;
        do {
          uVar12 = (ulong)(uint)((int)uVar12 + recv_size[lVar8]);
          lVar8 = lVar8 + 1;
        } while (lVar7 != lVar8);
      }
      if ((int)uVar12 < 0) {
        pcVar20 = "malloc b_xyz of REF_DBL negative";
        uVar14 = 0x704;
        goto LAB_001aed6f;
      }
      local_98 = pvVar9;
      pRVar10 = (REF_DBL *)malloc((ulong)(uint)((int)uVar12 * 3) << 3);
      if (pRVar10 == (REF_DBL *)0x0) {
        pcVar20 = "malloc b_xyz of REF_DBL NULL";
        uVar14 = 0x704;
      }
      else {
        local_a8 = uVar12;
        local_a0 = pRVar10;
        pRVar10 = (REF_DBL *)malloc(uVar12 << 3);
        if (pRVar10 == (REF_DBL *)0x0) {
          pcVar20 = "malloc b_dist of REF_DBL NULL";
          uVar14 = 0x705;
        }
        else {
          if (iVar11 < 0) {
            pcVar20 = "malloc a_next of REF_INT negative";
            uVar14 = 0x707;
LAB_001aed6f:
            printf("%s: %d: %s: %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_phys.c",
                   uVar14,"ref_phys_wall_distance",pcVar20);
            return 1;
          }
          local_c0 = pRVar10;
          __ptr = (int *)malloc(lVar7 * 4);
          if (__ptr == (int *)0x0) {
            pcVar20 = "malloc a_next of REF_INT NULL";
            uVar14 = 0x707;
          }
          else {
            *__ptr = 0;
            if (1 < iVar11) {
              iVar11 = *__ptr;
              lVar8 = 0;
              do {
                iVar11 = iVar11 + send_size[lVar8];
                __ptr[lVar8 + 1] = iVar11;
                lVar8 = lVar8 + 1;
              } while (lVar7 + -1 != lVar8);
            }
            if (ref_node->max < 1) {
              local_f8 = 0;
            }
            else {
              pRVar1 = ref_node->global;
              lVar7 = 0;
              lVar8 = 0;
              local_f8 = 0;
              iVar11 = 0;
              do {
                if (((-1 < pRVar1[lVar8]) && (ref_node->ref_mpi->id == ref_node->part[lVar8])) &&
                   (iVar11 < iVar4)) {
                  iVar15 = ref_mpi->n;
                  iVar17 = (iVar4 + -1 + iVar15) / iVar15;
                  iVar16 = iVar11 / iVar17;
                  iVar5 = (iVar4 + -1) / iVar15;
                  iVar15 = iVar4 - iVar15 * iVar5;
                  if (iVar15 <= iVar16) {
                    iVar16 = (iVar11 - iVar17 * iVar15) / iVar5 + iVar15;
                  }
                  if (ref_mpi->id == iVar16) {
                    *(int *)((long)local_f0 + (long)(int)local_f8 * 4) = (int)lVar8;
                    local_f8 = (ulong)((int)local_f8 + 1);
                  }
                  else {
                    iVar15 = __ptr[iVar16];
                    pRVar10 = ref_node->real;
                    lVar19 = 0;
                    do {
                      *(undefined8 *)((long)local_90 + lVar19 * 8 + (long)iVar15 * 0x18) =
                           *(undefined8 *)((long)pRVar10 + lVar19 * 8 + lVar7);
                      lVar19 = lVar19 + 1;
                    } while (lVar19 != 3);
                    __ptr[iVar16] = __ptr[iVar16] + 1;
                  }
                  iVar11 = iVar11 + 1;
                }
                lVar8 = lVar8 + 1;
                lVar7 = lVar7 + 0x78;
              } while (lVar8 < ref_node->max);
            }
            uVar14 = CONCAT44(uVar23,3);
            uVar22 = ref_mpi_alltoallv(ref_mpi,local_90,send_size,local_a0,recv_size,3,3);
            if (uVar22 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_phys.c"
                     ,0x723,"ref_phys_wall_distance",(ulong)uVar22,"alltoallv xyz");
              return uVar22;
            }
            if ((int)local_a8 != 0) {
              uVar12 = 1;
              if (1 < (int)local_a8) {
                uVar12 = local_a8 & 0xffffffff;
              }
              uVar13 = 0;
              do {
                local_c0[uVar13] = 1e+200;
                uVar13 = uVar13 + 1;
              } while (uVar12 != uVar13);
            }
            iVar11 = ref_node->max;
            if (0 < (long)iVar11) {
              pRVar1 = ref_node->global;
              lVar7 = 0;
              do {
                if (-1 < pRVar1[lVar7]) {
                  distance[lVar7] = 1e+200;
                }
                lVar7 = lVar7 + 1;
              } while (iVar11 != lVar7);
            }
            uVar22 = ref_phys_local_wall(local_b8,ref_dict,(REF_INT *)&local_80,&local_7c,&local_78)
            ;
            if (uVar22 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_phys.c"
                     ,0x72c,"ref_phys_wall_distance",(ulong)uVar22,"local wall");
              return uVar22;
            }
            if (uVar3 != local_80) {
              printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_phys.c"
                     ,0x72d,"ref_phys_wall_distance","node_per miss match",(ulong)uVar3,
                     (long)(int)local_80);
              return 1;
            }
            if ((long)ref_mpi->n < 0) {
              pcVar20 = "malloc part_ncell of REF_INT negative";
              uVar14 = 0x72f;
              goto LAB_001aed6f;
            }
            part_ncell = (REF_INT *)malloc((long)ref_mpi->n << 2);
            if (part_ncell != (REF_INT *)0x0) {
              uVar22 = ref_mpi_allgather(ref_mpi,&local_7c,part_ncell,1);
              if (uVar22 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_phys.c"
                       ,0x731,"ref_phys_wall_distance",(ulong)uVar22,"allgather part ncell",uVar14);
                return uVar22;
              }
              local_d0 = 0;
              if (0 < ref_mpi->n) {
                local_68 = local_78;
                local_84 = uVar3 * 3;
                local_70 = 1;
                if (1 < (int)local_a8) {
                  local_70 = local_a8 & 0xffffffff;
                }
                local_60 = local_f8;
                do {
                  local_d8 = (REF_DBL *)0x0;
                  local_cc = 0;
                  uVar6 = ref_phys_bcast_parts
                                    (ref_mpi,&local_d0,part_ncell,uVar3,(REF_INT)local_68,
                                     (REF_DBL *)&local_cc,(REF_INT *)&local_d8,
                                     in_stack_fffffffffffffed0);
                  uVar22 = local_cc;
                  if (uVar6 != 0) {
                    printf("%s: %d: %s: %d %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_phys.c"
                           ,0x73b,"ref_phys_wall_distance",(ulong)uVar6,"bcast part");
                    return uVar6;
                  }
                  uVar12 = (ulong)local_cc;
                  uVar6 = ref_search_create(&local_b0,local_cc);
                  if (uVar6 != 0) {
                    printf("%s: %d: %s: %d %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_phys.c"
                           ,0x73d,"ref_phys_wall_distance",(ulong)uVar6,"make search");
                    return uVar6;
                  }
                  if ((int)uVar22 < 0) {
                    pcVar20 = "malloc permutation of REF_INT negative";
                    uVar14 = 0x73e;
                    goto LAB_001aed6f;
                  }
                  permutation = (REF_INT *)malloc(uVar12 * 4);
                  if (permutation == (REF_INT *)0x0) {
                    pcVar20 = "malloc permutation of REF_INT NULL";
                    uVar14 = 0x73e;
                    goto LAB_001af034;
                  }
                  uVar6 = ref_sort_shuffle(uVar22,permutation);
                  if (uVar6 != 0) {
                    printf("%s: %d: %s: %d %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_phys.c"
                           ,0x740,"ref_phys_wall_distance",(ulong)uVar6,"shuffle");
                    return uVar6;
                  }
                  if (uVar12 != 0) {
                    local_c8 = local_d8;
                    if ((int)uVar22 < 2) {
                      uVar22 = 1;
                    }
                    local_58 = (ulong)uVar22;
                    uVar12 = 0;
                    do {
                      item = permutation[uVar12];
                      uVar22 = ref_node_bounding_sphere_xyz
                                         (local_c8 + local_84 * item,uVar3,local_48,&local_50);
                      if (uVar22 != 0) {
                        printf("%s: %d: %s: %d %s\n",
                               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_phys.c"
                               ,0x745,"ref_phys_wall_distance",(ulong)uVar22,"bound");
                        return uVar22;
                      }
                      uVar22 = ref_search_insert(local_b0,item,local_48,local_50 * 1.00000001);
                      if (uVar22 != 0) {
                        printf("%s: %d: %s: %d %s\n",
                               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_phys.c"
                               ,0x746,"ref_phys_wall_distance",(ulong)uVar22,"ins");
                        return uVar22;
                      }
                      uVar12 = uVar12 + 1;
                    } while (local_58 != uVar12);
                  }
                  free(permutation);
                  pRVar10 = local_d8;
                  if ((int)local_a8 != 0) {
                    local_108 = local_c0;
                    local_c8 = local_a0;
                    uVar12 = local_70;
                    do {
                      uVar22 = ref_search_nearest_element(local_b0,uVar3,pRVar10,local_c8,local_108)
                      ;
                      if (uVar22 != 0) {
                        printf("%s: %d: %s: %d %s\n",
                               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_phys.c"
                               ,0x74d,"ref_phys_wall_distance",(ulong)uVar22,"balanced candidates");
                        return uVar22;
                      }
                      local_c8 = local_c8 + 3;
                      local_108 = local_108 + 1;
                      uVar12 = uVar12 - 1;
                    } while (uVar12 != 0);
                  }
                  pRVar10 = local_d8;
                  if (0 < (int)local_f8) {
                    uVar12 = 0;
                    do {
                      lVar7 = (long)*(int *)((long)local_f0 + uVar12 * 4);
                      uVar22 = ref_search_nearest_element
                                         (local_b0,uVar3,pRVar10,local_b8->node->real + lVar7 * 0xf,
                                          distance + lVar7);
                      if (uVar22 != 0) {
                        printf("%s: %d: %s: %d %s\n",
                               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_phys.c"
                               ,0x755,"ref_phys_wall_distance",(ulong)uVar22,"stationary candidates"
                              );
                        return uVar22;
                      }
                      uVar12 = uVar12 + 1;
                    } while (local_60 != uVar12);
                  }
                  uVar22 = ref_search_free(local_b0);
                  if (uVar22 != 0) {
                    printf("%s: %d: %s: %d %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_phys.c"
                           ,0x757,"ref_phys_wall_distance",(ulong)uVar22,"free");
                    return uVar22;
                  }
                  if (local_d8 != (REF_DBL *)0x0) {
                    free(local_d8);
                  }
                } while (local_d0 < ref_mpi->n);
              }
              free(part_ncell);
              if (local_78 != (REF_DBL *)0x0) {
                free(local_78);
              }
              uVar3 = ref_mpi_alltoallv(ref_mpi,local_c0,recv_size,local_98,send_size,1,3);
              if (uVar3 == 0) {
                *__ptr = 0;
                iVar11 = ref_mpi->n;
                if (1 < (long)iVar11) {
                  iVar15 = *__ptr;
                  lVar7 = 0;
                  do {
                    iVar15 = iVar15 + send_size[lVar7];
                    __ptr[lVar7 + 1] = iVar15;
                    lVar7 = lVar7 + 1;
                  } while ((long)iVar11 + -1 != lVar7);
                }
                iVar15 = ref_node->max;
                if (0 < (long)iVar15) {
                  pRVar1 = ref_node->global;
                  local_b8 = (REF_GRID)CONCAT44(local_b8._4_4_,iVar4 + -1);
                  lVar7 = 0;
                  iVar5 = 0;
                  do {
                    if (((-1 < pRVar1[lVar7]) && (ref_node->ref_mpi->id == ref_node->part[lVar7]))
                       && (iVar5 < iVar4)) {
                      iVar21 = (iVar4 + iVar11 + -1) / iVar11;
                      iVar18 = iVar5 / iVar21;
                      iVar16 = (iVar4 + -1) / iVar11;
                      iVar17 = iVar4 - iVar16 * iVar11;
                      if (iVar17 <= iVar18) {
                        iVar18 = (iVar5 - iVar21 * iVar17) / iVar16 + iVar17;
                      }
                      if (ref_mpi->id != iVar18) {
                        iVar16 = __ptr[iVar18];
                        distance[lVar7] = *(REF_DBL *)((long)local_98 + (long)iVar16 * 8);
                        __ptr[iVar18] = iVar16 + 1;
                      }
                      iVar5 = iVar5 + 1;
                    }
                    lVar7 = lVar7 + 1;
                  } while (iVar15 != lVar7);
                }
                uVar3 = ref_node_ghost_dbl(ref_node,distance,1);
                if (uVar3 != 0) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_phys.c"
                         ,0x776,"ref_phys_wall_distance",(ulong)uVar3,"ghost distance");
                  return uVar3;
                }
                free(local_c0);
                free(local_a0);
                free(local_98);
                free(local_90);
                free(__ptr);
                if (local_f0 != (void *)0x0) {
                  free(local_f0);
                }
                if (recv_size != (REF_INT *)0x0) {
                  free(recv_size);
                }
                if (send_size != (REF_INT *)0x0) {
                  free(send_size);
                }
                return 0;
              }
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_phys.c"
                     ,0x761,"ref_phys_wall_distance",(ulong)uVar3,"alltoallv dist");
              return uVar3;
            }
            pcVar20 = "malloc part_ncell of REF_INT NULL";
            uVar14 = 0x72f;
          }
        }
      }
    }
  }
LAB_001af034:
  printf("%s: %d: %s: %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_phys.c",uVar14,
         "ref_phys_wall_distance",pcVar20);
  return 2;
}

Assistant:

REF_FCN REF_STATUS ref_phys_wall_distance(REF_GRID ref_grid, REF_DICT ref_dict,
                                          REF_DBL *distance) {
  REF_MPI ref_mpi = ref_grid_mpi(ref_grid);
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_INT nowned, nbalance, nstationary, *stationary;
  REF_INT ncell, local_ncell, *part_ncell, part_complete, max_ncell;
  REF_INT nnode, part;
  REF_INT a_total, b_total;
  REF_INT *a_size, *b_size;
  REF_INT *a_next;
  REF_DBL *a_xyz, *b_xyz;
  REF_DBL *a_dist, *b_dist;
  REF_DBL *local_xyz, *xyz;
  REF_INT local_node_per, node_per;
  REF_INT node, cell;
  REF_INT *permutation, i;
  REF_SEARCH ref_search;
  REF_DBL center[3], radius;
  REF_DBL scale = 1.0 + 1.0e-8;

  if (ref_grid_twod(ref_grid)) {
    node_per = 2;
  } else {
    node_per = 3;
  }

  ref_malloc_init(a_size, ref_mpi_n(ref_mpi), REF_INT, 0);
  ref_malloc_init(b_size, ref_mpi_n(ref_mpi), REF_INT, 0);

  nowned = 0;
  each_ref_node_valid_node(ref_node, node) {
    if (ref_node_owned(ref_node, node)) {
      nowned++;
    }
  }
  /* limit the nodes that are balanced to prevent all2all overload */
  nbalance = MIN(nowned, REF_INT_MAX / ref_mpi_n(ref_mpi));

  /* count the balanced nodes based on destination, count stationary */
  nnode = 0;
  nstationary = 0;
  each_ref_node_valid_node(ref_node, node) {
    if (ref_node_owned(ref_node, node)) {
      if (nnode < nbalance) {
        part = ref_part_implicit(nbalance, ref_mpi_n(ref_mpi), nnode);
        if (ref_mpi_rank(ref_mpi) == part) {
          nstationary++;
        } else {
          a_size[part]++;
        }
        nnode++;
      }
    }
  }
  ref_malloc_init(stationary, nstationary, REF_INT, REF_EMPTY);

  RSS(ref_mpi_alltoall(ref_mpi, a_size, b_size, REF_INT_TYPE),
      "alltoall sizes");

  a_total = 0;
  each_ref_mpi_part(ref_mpi, part) { a_total += a_size[part]; }
  ref_malloc(a_xyz, 3 * a_total, REF_DBL);
  ref_malloc(a_dist, a_total, REF_DBL);

  b_total = 0;
  each_ref_mpi_part(ref_mpi, part) { b_total += b_size[part]; }
  ref_malloc(b_xyz, 3 * b_total, REF_DBL);
  ref_malloc(b_dist, b_total, REF_DBL);

  ref_malloc(a_next, ref_mpi_n(ref_mpi), REF_INT);
  a_next[0] = 0;
  each_ref_mpi_worker(ref_mpi, part) {
    a_next[part] = a_next[part - 1] + a_size[part - 1];
  }

  /* fill the balanced nodes based on destination, fill stationary */
  nnode = 0;
  nstationary = 0;
  each_ref_node_valid_node(ref_node, node) {
    if (ref_node_owned(ref_node, node)) {
      if (nnode < nbalance) {
        part = ref_part_implicit(nbalance, ref_mpi_n(ref_mpi), nnode);
        if (ref_mpi_rank(ref_mpi) == part) {
          stationary[nstationary] = node;
          nstationary++;
        } else {
          for (i = 0; i < 3; i++) {
            a_xyz[i + 3 * a_next[part]] = ref_node_xyz(ref_node, i, node);
          }
          a_next[part]++;
        }
        nnode++;
      }
    }
  }

  RSS(ref_mpi_alltoallv(ref_mpi, a_xyz, a_size, b_xyz, b_size, 3, REF_DBL_TYPE),
      "alltoallv xyz");

  for (node = 0; node < b_total; node++) {
    b_dist[node] = REF_DBL_MAX;
  }
  each_ref_node_valid_node(ref_node, node) { distance[node] = REF_DBL_MAX; }

  RSS(ref_phys_local_wall(ref_grid, ref_dict, &local_node_per, &local_ncell,
                          &local_xyz),
      "local wall");
  REIS(node_per, local_node_per, "node_per miss match");

  ref_malloc(part_ncell, ref_mpi_n(ref_mpi), REF_INT);
  RSS(ref_mpi_allgather(ref_mpi, &local_ncell, part_ncell, REF_INT_TYPE),
      "allgather part ncell");

  max_ncell = 1000000; /* (8 * 3 * node_per) bytes per element */

  part_complete = 0;
  while (part_complete < ref_mpi_n(ref_mpi)) {
    xyz = NULL;
    ncell = 0;
    RSS(ref_phys_bcast_parts(ref_mpi, &part_complete, part_ncell, max_ncell,
                             node_per, local_xyz, &ncell, &xyz),
        "bcast part");

    RSS(ref_search_create(&ref_search, ncell), "make search");
    ref_malloc(permutation, ncell, REF_INT);
    /* permutation randomizes tree insertion to improve balance/reduce depth */
    RSS(ref_sort_shuffle(ncell, permutation), "shuffle");
    for (i = 0; i < ncell; i++) {
      cell = permutation[i];
      RSS(ref_node_bounding_sphere_xyz(&(xyz[3 * node_per * cell]), node_per,
                                       center, &radius),
          "bound");
      RSS(ref_search_insert(ref_search, cell, center, scale * radius), "ins");
    }
    ref_free(permutation);

    for (i = 0; i < b_total; i++) {
      RSS(ref_search_nearest_element(ref_search, node_per, xyz, &(b_xyz[3 * i]),
                                     &(b_dist[i])),
          "balanced candidates");
    }
    for (i = 0; i < nstationary; i++) {
      node = stationary[i];
      RSS(ref_search_nearest_element(
              ref_search, node_per, xyz,
              ref_node_xyz_ptr(ref_grid_node(ref_grid), node),
              &(distance[node])),
          "stationary candidates");
    }
    RSS(ref_search_free(ref_search), "free");

    ref_free(xyz);
  }

  ref_free(part_ncell);
  ref_free(local_xyz);

  RSS(ref_mpi_alltoallv(ref_mpi, b_dist, b_size, a_dist, a_size, 1,
                        REF_DBL_TYPE),
      "alltoallv dist");

  a_next[0] = 0;
  each_ref_mpi_worker(ref_mpi, part) {
    a_next[part] = a_next[part - 1] + a_size[part - 1];
  }
  nnode = 0;
  each_ref_node_valid_node(ref_node, node) {
    if (ref_node_owned(ref_node, node)) {
      if (nnode < nbalance) {
        part = ref_part_implicit(nbalance, ref_mpi_n(ref_mpi), nnode);
        if (ref_mpi_rank(ref_mpi) == part) {
        } else {
          distance[node] = a_dist[a_next[part]];
          a_next[part]++;
        }
        nnode++;
      }
    }
  }

  RSS(ref_node_ghost_dbl(ref_node, distance, 1), "ghost distance");

  ref_free(b_dist);
  ref_free(b_xyz);
  ref_free(a_dist);
  ref_free(a_xyz);
  ref_free(a_next);
  ref_free(stationary);
  ref_free(b_size);
  ref_free(a_size);
  return REF_SUCCESS;
}